

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.c
# Opt level: O3

void polygon_push_triangle_callback(int i0,int i1,int i2,void *user_data)

{
  long lVar1;
  ALLEGRO_PRIM_VERTEX_CACHE *cache;
  
  lVar1 = *(long *)((long)user_data + 0x2428);
  _al_prim_cache_push_triangle
            ((ALLEGRO_PRIM_VERTEX_CACHE *)user_data,(float *)(lVar1 + (long)(i0 * 2) * 4),
             (float *)(lVar1 + (long)(i1 * 2) * 4),(float *)(lVar1 + (long)(i2 * 2) * 4));
  return;
}

Assistant:

static void polygon_push_triangle_callback(int i0, int i1, int i2, void* user_data)
{
   ALLEGRO_PRIM_VERTEX_CACHE* cache = (ALLEGRO_PRIM_VERTEX_CACHE*)user_data;

   const float* vertices = (const float*)cache->user_data;

   const float* v0 = vertices + (i0 * 2);
   const float* v1 = vertices + (i1 * 2);
   const float* v2 = vertices + (i2 * 2);

   _al_prim_cache_push_triangle(cache, v0, v1, v2);
}